

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O0

void anon_unknown.dwarf_47aea5::DoCheck
               (string *prv,string *pub,string *norm_pub,int flags,
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *scripts,optional<OutputType> *type,optional<uint256> op_desc_id,
               set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *paths,bool replace_apostrophe_with_h_in_prv,bool replace_apostrophe_with_h_in_pub,
               uint32_t spender_nlocktime,uint32_t spender_nsequence,
               map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *preimages,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *expected_prv,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *expected_pub,int desc_index)

{
  long lVar1;
  Span<const_unsigned_char> s;
  bool bVar2;
  uint uVar3;
  int iVar4;
  pointer pDVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  const_reference pvVar9;
  reference pvVar10;
  FlatSigningProvider *creator_00;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffbd58;
  FlatSigningProvider *in_stack_ffffffffffffbd60;
  char *in_stack_ffffffffffffbd68;
  CExtPubKey *in_stack_ffffffffffffbd70;
  undefined7 in_stack_ffffffffffffbd78;
  undefined1 in_stack_ffffffffffffbd7f;
  lazy_ostream *in_stack_ffffffffffffbd80;
  PrecomputedTransactionData *in_stack_ffffffffffffbd88;
  SignatureData *line_num;
  undefined7 in_stack_ffffffffffffbd90;
  undefined1 in_stack_ffffffffffffbd97;
  PrecomputedTransactionData *in_stack_ffffffffffffbd98;
  CMutableTransaction *in_stack_ffffffffffffbda0;
  SignatureData *in_stack_ffffffffffffbda8;
  undefined7 in_stack_ffffffffffffbdb0;
  undefined1 in_stack_ffffffffffffbdb7;
  string *in_stack_ffffffffffffbdb8;
  SignatureData *in_stack_ffffffffffffbde0;
  undefined7 in_stack_ffffffffffffbde8;
  undefined1 in_stack_ffffffffffffbdef;
  reference in_stack_ffffffffffffbdf8;
  undefined4 in_stack_ffffffffffffbe00;
  int in_stack_ffffffffffffbe04;
  SignatureData *in_stack_ffffffffffffbe08;
  SignatureData *in_stack_ffffffffffffbe70;
  undefined7 in_stack_ffffffffffffbe78;
  undefined1 in_stack_ffffffffffffbe7f;
  SigningProvider *provider;
  FlatSigningProvider *local_3e08;
  ulong local_3df0;
  pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_> *origin;
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  *__range3;
  bool prod_sig_res;
  size_t n;
  CPubKey *pk_1;
  pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_> *origin_pair_1;
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  *__range5_2;
  CExtPubKey *xpub_2;
  value_type *xpub_pair_2;
  ExtPubKeyMap *__range5_1;
  CExtPubKey *xpub_1;
  value_type *xpub_pair_1;
  unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
  *__range6;
  value_type *xpub_map_pair;
  unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
  *__range5;
  CPubKey *pk;
  pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_> *origin_pair;
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  *__range4_1;
  CExtPubKey *xpub;
  value_type *xpub_pair;
  ExtPubKeyMap *__range4;
  ExtPubKeyMap *parent_xpub_cache;
  unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
  *der_xpub_cache;
  FlatSigningProvider *key_provider;
  int t;
  value_type *ref;
  size_t i;
  size_t max;
  bool is_combo;
  bool is_input_size_info_set;
  bool is_nontop_or_nonsolvable;
  value_type *parse_pub;
  value_type *parse_priv;
  bool replace_apostrophe_with_h_in_pub_local;
  bool replace_apostrophe_with_h_in_prv_local;
  optional<OutputType> *type_local;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *scripts_local;
  int flags_local;
  string *norm_pub_local;
  string *pub_local;
  string *prv_local;
  const_string local_3878;
  lazy_ostream local_3868 [2];
  assertion_result local_3848 [2];
  const_string local_3810;
  lazy_ostream local_3800 [2];
  CMutableTransaction *local_37e0;
  assertion_result local_37d8 [2];
  iterator __end3;
  iterator __begin3;
  const_string local_3790 [2];
  lazy_ostream local_3770 [2];
  assertion_result local_3750 [2];
  undefined1 local_3711 [129];
  lazy_ostream local_3690 [2];
  assertion_result local_3670 [2];
  undefined1 local_3634 [124];
  lazy_ostream local_35b8 [2];
  assertion_result local_3598 [2];
  vector<CScript,_std::allocator<CScript>_> spks_inferred;
  undefined1 local_3542 [82];
  unique_ptr<Descriptor,_std::default_delete<Descriptor>_> inferred;
  lazy_ostream local_34d8 [2];
  assertion_result local_34b8 [2];
  undefined8 local_3480;
  MutableTransactionSignatureCreator creator;
  undefined1 local_3421;
  vector<CTxOut,_std::allocator<CTxOut>_> utxos;
  CMutableTransaction spend;
  undefined1 local_33c0 [16];
  undefined1 local_33b0 [64];
  const_string local_3370 [2];
  lazy_ostream local_3350 [2];
  assertion_result local_3330 [2];
  const_string local_32f8 [2];
  lazy_ostream local_32d8 [2];
  assertion_result local_32b8 [2];
  const_string local_3280 [2];
  lazy_ostream local_3260 [2];
  assertion_result local_3240 [2];
  const_string local_3208 [2];
  lazy_ostream local_31e8 [2];
  assertion_result local_31c8 [2];
  const_string local_3190 [2];
  lazy_ostream local_3170 [2];
  assertion_result local_3150 [2];
  const_string local_3118 [2];
  lazy_ostream local_30f8 [2];
  assertion_result local_30d8 [2];
  vector<CScript,_std::allocator<CScript>_> spk1_from_cache;
  vector<CScript,_std::allocator<CScript>_> spks1;
  const_string local_3070 [2];
  lazy_ostream local_3050 [2];
  assertion_result local_3030 [2];
  undefined8 local_3000;
  const_string local_2ff8 [2];
  lazy_ostream local_2fd8 [2];
  assertion_result local_2fb8 [2];
  size_type local_2f80;
  undefined1 local_2f78 [16];
  undefined1 local_2f68 [64];
  undefined1 local_2f28 [16];
  undefined1 local_2f18 [64];
  iterator __end5_2;
  iterator __begin5_2;
  int count_pks_1;
  const_string local_2ec0 [2];
  lazy_ostream local_2ea0 [2];
  assertion_result local_2e80 [2];
  const_iterator __end5_1;
  const_iterator __begin5_1;
  const_iterator __end6;
  const_iterator __begin6;
  const_iterator __end5;
  const_iterator __begin5;
  const_string local_2e18 [2];
  lazy_ostream local_2df8 [2];
  assertion_result local_2dd8 [2];
  const_string local_2da0 [2];
  lazy_ostream local_2d80 [2];
  assertion_result local_2d60 [2];
  size_type local_2d28;
  undefined1 local_2d20 [16];
  undefined1 local_2d10 [64];
  undefined1 local_2cd0 [16];
  undefined1 local_2cc0 [64];
  iterator __end4_1;
  iterator __begin4_1;
  int count_pks;
  const_string local_2c68 [2];
  lazy_ostream local_2c48 [2];
  assertion_result local_2c28 [2];
  const_iterator __end4;
  const_iterator __begin4;
  const_string local_2be0 [2];
  lazy_ostream local_2bc0 [2];
  assertion_result local_2ba0 [2];
  const_string local_2b68 [2];
  lazy_ostream local_2b48 [2];
  assertion_result local_2b28 [2];
  size_t num_xpubs;
  const_string local_2a78 [2];
  lazy_ostream local_2a58 [2];
  assertion_result local_2a38 [2];
  const_string local_2a00 [2];
  lazy_ostream local_29e0 [2];
  assertion_result local_29c0 [2];
  const_string local_2988 [2];
  lazy_ostream local_2968 [2];
  assertion_result local_2948 [2];
  const_string local_2910 [2];
  lazy_ostream local_28f0 [2];
  assertion_result local_28d0 [2];
  const_string local_2898 [2];
  lazy_ostream local_2878 [2];
  assertion_result local_2858 [2];
  undefined1 local_2820 [128];
  lazy_ostream local_27a0 [2];
  assertion_result local_2780 [2];
  DescriptorCache desc_cache;
  vector<CScript,_std::allocator<CScript>_> spks_cached;
  vector<CScript,_std::allocator<CScript>_> spks;
  undefined1 local_266a [89];
  byte local_2611;
  undefined1 local_2610 [16];
  undefined1 local_2600 [64];
  const_string local_25c0;
  lazy_ostream local_25b0 [2];
  assertion_result local_2590 [2];
  const_string local_2558 [2];
  lazy_ostream local_2538 [2];
  assertion_result local_2518 [2];
  const_string local_24e0;
  lazy_ostream local_24d0 [2];
  assertion_result local_24b0 [2];
  const_string local_2478 [2];
  lazy_ostream local_2458 [2];
  assertion_result local_2438 [2];
  const_string local_2400 [2];
  lazy_ostream local_23e0 [2];
  assertion_result local_23c0 [2];
  const_string local_2388;
  lazy_ostream local_2378 [2];
  assertion_result local_2358 [2];
  const_string local_2320;
  lazy_ostream local_2310 [2];
  assertion_result local_22f0 [2];
  const_string local_22b8 [2];
  lazy_ostream local_2298 [2];
  assertion_result local_2278 [2];
  const_string local_2240 [2];
  lazy_ostream local_2220 [2];
  assertion_result local_2200 [2];
  const_string local_21c8 [2];
  lazy_ostream local_21a8 [2];
  assertion_result local_2188 [2];
  const_string local_2150;
  lazy_ostream local_2140 [2];
  assertion_result local_2120 [2];
  const_string local_20e8;
  lazy_ostream local_20d8 [2];
  assertion_result local_20b8 [2];
  const_string local_2080 [2];
  lazy_ostream local_2060 [2];
  assertion_result local_2040 [2];
  const_string local_2008;
  lazy_ostream local_1ff8 [2];
  assertion_result local_1fd8 [2];
  const_string local_1fa0;
  lazy_ostream local_1f90 [2];
  assertion_result local_1f70 [2];
  const_string local_1f38;
  lazy_ostream local_1f28 [2];
  assertion_result local_1f08 [2];
  const_string local_1ed0;
  lazy_ostream local_1ec0 [2];
  assertion_result local_1ea0 [2];
  const_string local_1e68;
  lazy_ostream local_1e58 [2];
  assertion_result local_1e38 [2];
  const_string local_1e00 [2];
  lazy_ostream local_1de0 [2];
  assertion_result local_1dc0 [2];
  const_string local_1d88 [2];
  lazy_ostream local_1d68 [2];
  size_type local_1d48;
  assertion_result local_1d40 [2];
  const_string local_1d08 [2];
  lazy_ostream local_1ce8 [2];
  assertion_result local_1cc8 [2];
  const_string local_1c90 [2];
  lazy_ostream local_1c70 [2];
  assertion_result local_1c50 [2];
  const_string local_1c18;
  lazy_ostream local_1c08 [2];
  ulong local_1be8;
  assertion_result local_1be0 [2];
  const_string local_1ba8;
  lazy_ostream local_1b98 [2];
  assertion_result local_1b78 [2];
  const_string local_1b40;
  lazy_ostream local_1b30 [2];
  assertion_result local_1b10 [3];
  const_string local_1ac0;
  lazy_ostream local_1ab0 [2];
  assertion_result local_1a90 [3];
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  parse_pubs;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  parse_privs;
  optional<long> max_elems;
  optional<long> max_sat_nonmaxsig;
  optional<long> max_sat_maxsig;
  FlatSigningProvider provider_inferred;
  SignatureData sigdata;
  PrecomputedTransactionData txdata;
  undefined1 local_1138 [224];
  FlatSigningProvider script_provider_cached1;
  FlatSigningProvider script_provider1;
  CExtPubKey der_1;
  set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> pubkeys_1;
  CExtPubKey der;
  set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> pubkeys;
  FlatSigningProvider script_provider_cached;
  FlatSigningProvider script_provider;
  string norm1;
  string prv1;
  string pub2;
  string pub1;
  string error;
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  left_paths;
  FlatSigningProvider keys_pub;
  FlatSigningProvider keys_priv;
  
  script_provider_cached1.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  local_2008.m_end = (iterator)0x0;
  local_3000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FlatSigningProvider::FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
  FlatSigningProvider::FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
  std::
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::set((set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         *)in_stack_ffffffffffffbd58,
        (set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         *)0x62286f);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffbd70);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
            *)in_stack_ffffffffffffbd58);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
            *)in_stack_ffffffffffffbd58);
  if (replace_apostrophe_with_h_in_prv) {
    UseHInsteadOfApostrophe((string *)in_stack_ffffffffffffbda8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffbdb8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffbdb7,in_stack_ffffffffffffbdb0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
  }
  Parse(in_stack_ffffffffffffbdb8,
        (FlatSigningProvider *)CONCAT17(in_stack_ffffffffffffbdb7,in_stack_ffffffffffffbdb0),
        (string *)in_stack_ffffffffffffbda8,SUB81((ulong)in_stack_ffffffffffffbda0 >> 0x38,0));
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::operator=((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
               *)in_stack_ffffffffffffbd68,
              (vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
               *)in_stack_ffffffffffffbd60);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)in_stack_ffffffffffffbd68);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::empty((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)in_stack_ffffffffffffbd68);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd68,
               SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    in_stack_ffffffffffffbd58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_1a90,local_1ab0,&local_1ac0,0x97,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  if (replace_apostrophe_with_h_in_pub) {
    UseHInsteadOfApostrophe((string *)in_stack_ffffffffffffbda8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffbdb8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffbdb7,in_stack_ffffffffffffbdb0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
  }
  Parse(in_stack_ffffffffffffbdb8,
        (FlatSigningProvider *)CONCAT17(in_stack_ffffffffffffbdb7,in_stack_ffffffffffffbdb0),
        (string *)in_stack_ffffffffffffbda8,SUB81((ulong)in_stack_ffffffffffffbda0 >> 0x38,0));
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::operator=((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
               *)in_stack_ffffffffffffbd68,
              (vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
               *)in_stack_ffffffffffffbd60);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)in_stack_ffffffffffffbd68);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::empty((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)in_stack_ffffffffffffbd68);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd68,
               SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    in_stack_ffffffffffffbd58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_1b10,local_1b30,&local_1b40,0x9c,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::at((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        *)in_stack_ffffffffffffbd68,(size_type)in_stack_ffffffffffffbd60);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::at((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        *)in_stack_ffffffffffffbd68,(size_type)in_stack_ffffffffffffbd60);
  pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                     ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                      in_stack_ffffffffffffbd58);
  uVar3 = (*pDVar5->_vptr_Descriptor[3])();
  if ((uVar3 & 1) != 0) {
    pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                       ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                        in_stack_ffffffffffffbd58);
    (*pDVar5->_vptr_Descriptor[0xb])();
    std::optional::operator_cast_to_bool((optional<OutputType> *)in_stack_ffffffffffffbd58);
  }
  pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                     ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                      in_stack_ffffffffffffbd58);
  (*pDVar5->_vptr_Descriptor[0xd])(pDVar5,1);
  pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                     ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                      in_stack_ffffffffffffbd58);
  (*pDVar5->_vptr_Descriptor[0xd])(pDVar5,1);
  pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                     ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                      in_stack_ffffffffffffbd58);
  (*pDVar5->_vptr_Descriptor[0xe])();
  bVar2 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffbd58);
  if ((bVar2) &&
     (bVar2 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffbd58),
     bVar2)) {
    std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffbd58);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd68,
               SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    in_stack_ffffffffffffbd58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_1b78,local_1b98,&local_1ba8,0xa7,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                     ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                      in_stack_ffffffffffffbd58);
  iVar4 = (*pDVar5->_vptr_Descriptor[5])();
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    if ((((byte)iVar4 ^ 0xff) & 1) == 0) {
      pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                         ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                          in_stack_ffffffffffffbd58);
      (*pDVar5->_vptr_Descriptor[0xc])();
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_ffffffffffffbd68,(size_type)in_stack_ffffffffffffbd60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffbd68,(size_type)in_stack_ffffffffffffbd60);
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffbd58);
      local_1be8 = sVar6 >> 1;
      std::operator==((optional<long> *)in_stack_ffffffffffffbd68,
                      (unsigned_long *)in_stack_ffffffffffffbd60);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd68,
               SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    std::operator+(&in_stack_ffffffffffffbda8->complete,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    in_stack_ffffffffffffbd58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_1be0,local_1c08,&local_1c18,0xab,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffbd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                       ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                        in_stack_ffffffffffffbd58);
    (*pDVar5->_vptr_Descriptor[0xb])();
    std::operator==((optional<OutputType> *)
                    CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                    (optional<OutputType> *)in_stack_ffffffffffffbd70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd68,
               SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,
               (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    in_stack_ffffffffffffbd58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c50,local_1c70,local_1c90,0xae,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                       ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                        in_stack_ffffffffffffbd58);
    (*pDVar5->_vptr_Descriptor[0xb])();
    std::operator==((optional<OutputType> *)
                    CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                    (optional<OutputType> *)in_stack_ffffffffffffbd70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd68,
               SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,
               (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    in_stack_ffffffffffffbd58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1cc8,local_1ce8,local_1d08,0xaf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    local_1d48 = std::
                 map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                 ::size((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                         *)in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::assertion_result<unsigned_long>
              ((assertion_result *)in_stack_ffffffffffffbd68,
               (unsigned_long *)in_stack_ffffffffffffbd60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,
               (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    in_stack_ffffffffffffbd58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1d40,local_1d68,local_1d88,0xb2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::size
              ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                *)in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd68,
               SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,
               (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    in_stack_ffffffffffffbd58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1dc0,local_1de0,local_1e00,0xb3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                     ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                      in_stack_ffffffffffffbd58);
  (*pDVar5->_vptr_Descriptor[4])(&pub1,pDVar5,0);
  pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                     ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                      in_stack_ffffffffffffbd58);
  (*pDVar5->_vptr_Descriptor[4])(&pub2,pDVar5,0);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffbd58);
  if (bVar2) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                 (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffbd58);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbda0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd98);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbda0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd98);
      EqualDescriptor((string *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                      (string *)in_stack_ffffffffffffbd70);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd68,
                 SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::operator+(&in_stack_ffffffffffffbda8->complete,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbda0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd70,in_stack_ffffffffffffbd68);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffbd58);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd68);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbd60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      in_stack_ffffffffffffbd58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1e38,local_1e58,&local_1e68,0xba,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                 (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffbd58);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbda0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd98);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbda0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd98);
      EqualDescriptor((string *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                      (string *)in_stack_ffffffffffffbd70);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd68,
                 SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::operator+(&in_stack_ffffffffffffbda8->complete,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbda0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd70,in_stack_ffffffffffffbd68);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffbd58);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd68);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbd60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      in_stack_ffffffffffffbd58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1ea0,local_1ec0,&local_1ed0,0xbb,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                 (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbda0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd98);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbda0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd98);
      EqualDescriptor((string *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                      (string *)in_stack_ffffffffffffbd70);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd68,
                 SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::operator+(&in_stack_ffffffffffffbda8->complete,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbda0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd70,in_stack_ffffffffffffbd68);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd68);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbd60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      in_stack_ffffffffffffbd58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1f08,local_1f28,&local_1f38,0xbd,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                 (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbda0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd98);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbda0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd98);
      EqualDescriptor((string *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                      (string *)in_stack_ffffffffffffbd70);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd68,
                 SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::operator+(&in_stack_ffffffffffffbda8->complete,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbda0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd70,in_stack_ffffffffffffbd68);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd68);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbd60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      in_stack_ffffffffffffbd58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1f70,local_1f90,&local_1fa0,0xbe,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffbd58);
  if (bVar2) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                 (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
      std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator*
                ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                 in_stack_ffffffffffffbd68);
      DescriptorID((Descriptor *)in_stack_ffffffffffffbda0);
      std::optional<uint256>::operator*((optional<uint256> *)in_stack_ffffffffffffbd58);
      ::operator==((base_blob<256U> *)in_stack_ffffffffffffbd68,
                   (base_blob<256U> *)in_stack_ffffffffffffbd60);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd68,
                 SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator*
                ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                 in_stack_ffffffffffffbd68);
      DescriptorID((Descriptor *)in_stack_ffffffffffffbda0);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffbd60);
      std::operator+((char *)in_stack_ffffffffffffbd70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd68);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd70,in_stack_ffffffffffffbd68);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd68);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbd60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      in_stack_ffffffffffffbd58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1fd8,local_1ff8,&local_2008,0xc3,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffbd58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  if ((flags & 0x80U) == 0) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd70);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                 (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
      pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                         ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                          in_stack_ffffffffffffbd58);
      (*pDVar5->_vptr_Descriptor[6])(pDVar5,&keys_priv,&prv1);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd68,
                 SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbd60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      in_stack_ffffffffffffbd58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2040,local_2060,local_2080,0xc9,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffbd58);
    if (bVar2) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                   (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_ffffffffffffbd58);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd98);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd98);
        EqualDescriptor((string *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                        (string *)in_stack_ffffffffffffbd70);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd68,
                   SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        std::operator+(&in_stack_ffffffffffffbda8->complete,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbda0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbd70,in_stack_ffffffffffffbd68);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_ffffffffffffbd58);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbd70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbd68);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbd60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        in_stack_ffffffffffffbd58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_20b8,local_20d8,&local_20e8,0xcb,CHECK)
        ;
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                   (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd98);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd98);
        EqualDescriptor((string *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                        (string *)in_stack_ffffffffffffbd70);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd68,
                   SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        std::operator+(&in_stack_ffffffffffffbda8->complete,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbda0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbd70,in_stack_ffffffffffffbd68);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbd70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbd68);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbd60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        in_stack_ffffffffffffbd58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_2120,local_2140,&local_2150,0xcd,CHECK)
        ;
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                 (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
      pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                         ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                          in_stack_ffffffffffffbd58);
      (*pDVar5->_vptr_Descriptor[6])(pDVar5,&keys_pub,&prv1);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd68,
                 SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbd60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      in_stack_ffffffffffffbd58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2188,local_21a8,local_21c8,0xcf,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                 (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
      pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                         ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                          in_stack_ffffffffffffbd58);
      (*pDVar5->_vptr_Descriptor[6])(pDVar5,&keys_priv,&prv1);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd68,
                 SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbd60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      in_stack_ffffffffffffbd58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2200,local_2220,local_2240,0xd0,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffbd58);
    if (bVar2) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                   (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_ffffffffffffbd58);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd98);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd98);
        EqualDescriptor((string *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                        (string *)in_stack_ffffffffffffbd70);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd68,
                   SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbd60,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        in_stack_ffffffffffffbd58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_2278,local_2298,local_22b8,0xd2,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffbd58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                   (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_ffffffffffffbd58);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd98);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd98);
        EqualDescriptor((string *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                        (string *)in_stack_ffffffffffffbd70);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd68,
                   SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        std::operator+(&in_stack_ffffffffffffbda8->complete,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbda0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbd70,in_stack_ffffffffffffbd68);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_ffffffffffffbd58);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbd70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbd68);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbd60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        in_stack_ffffffffffffbd58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_22f0,local_2310,&local_2320,0xd3,CHECK)
        ;
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                   (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd98);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd98);
        EqualDescriptor((string *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                        (string *)in_stack_ffffffffffffbd70);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd68,
                   SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        std::operator+(&in_stack_ffffffffffffbda8->complete,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbda0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbd70,in_stack_ffffffffffffbd68);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbd70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbd68);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbd60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        in_stack_ffffffffffffbd58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_2358,local_2378,&local_2388,0xd5,CHECK)
        ;
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                 (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
      pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                         ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                          in_stack_ffffffffffffbd58);
      (*pDVar5->_vptr_Descriptor[6])(pDVar5,&keys_pub,&prv1);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd68,
                 SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbd60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                 (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
      in_stack_ffffffffffffbd58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_23c0,local_23e0,local_2400,0xd7,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffbd70);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                       ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                        in_stack_ffffffffffffbd58);
    (*pDVar5->_vptr_Descriptor[7])(pDVar5,&keys_priv,&norm1,0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd68,
               SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,
               (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    in_stack_ffffffffffffbd58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2438,local_2458,local_2478,0xdc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbda0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd98);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbda0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd98);
    EqualDescriptor((string *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                    (string *)in_stack_ffffffffffffbd70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd68,
               SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    std::operator+(&in_stack_ffffffffffffbda8->complete,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd70,in_stack_ffffffffffffbd68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    in_stack_ffffffffffffbd58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_24b0,local_24d0,&local_24e0,0xdd,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffbd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                       ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                        in_stack_ffffffffffffbd58);
    (*pDVar5->_vptr_Descriptor[7])(pDVar5,&keys_priv,&norm1,0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd68,
               SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,
               (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    in_stack_ffffffffffffbd58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2518,local_2538,local_2558,0xde,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbda0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd98);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbda0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd98);
    EqualDescriptor((string *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                    (string *)in_stack_ffffffffffffbd70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd68,
               SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    std::operator+(&in_stack_ffffffffffffbda8->complete,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd70,in_stack_ffffffffffffbd68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbd68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    in_stack_ffffffffffffbd58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_2590,local_25b0,&local_25c0,0xdf,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffbd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,(char (*) [1])in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                       ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                        in_stack_ffffffffffffbd58);
    iVar4 = (*pDVar5->_vptr_Descriptor[2])();
    local_2611 = (byte)iVar4 & 1;
    flags_local._0_1_ = (byte)flags;
    local_266a[0x58] = (byte)flags_local & 1;
    in_stack_ffffffffffffbd68 = "(flags & RANGE) != 0";
    in_stack_ffffffffffffbd60 = (FlatSigningProvider *)(local_266a + 0x58);
    in_stack_ffffffffffffbd58 = "parse_pub->IsRange()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_2600,local_2610,0xe2,1,2,&local_2611);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,(char (*) [1])in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                       ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                        in_stack_ffffffffffffbd58);
    iVar4 = (*pDVar5->_vptr_Descriptor[2])();
    local_266a[1] = (byte)iVar4 & 1;
    local_266a[0] = (byte)flags_local & 1;
    in_stack_ffffffffffffbd68 = "(flags & RANGE) != 0";
    in_stack_ffffffffffffbd60 = (FlatSigningProvider *)local_266a;
    in_stack_ffffffffffffbd58 = "parse_priv->IsRange()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_266a + 0x12,local_266a + 2,0xe3,1,2,local_266a + 1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  if (((flags & 1U) == 0) &&
     (sVar7 = std::
              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::size((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_ffffffffffffbd58), sVar7 != 1)) {
    __assert_fail("scripts.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
                  ,0xec,
                  "void (anonymous namespace)::DoCheck(std::string, std::string, const std::string &, int, const std::vector<std::vector<std::string>> &, const std::optional<OutputType> &, std::optional<uint256>, const std::set<std::vector<uint32_t>> &, bool, bool, uint32_t, uint32_t, std::map<std::vector<uint8_t>, std::vector<uint8_t>>, std::optional<std::string>, std::optional<std::string>, int)"
                 );
  }
  if ((flags & 1U) == 0) {
    local_3df0 = 3;
  }
  else {
    local_3df0 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::size((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)in_stack_ffffffffffffbd58);
  }
  for (i = 0; i < local_3df0; i = i + 1) {
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_ffffffffffffbd68,(size_type)in_stack_ffffffffffffbd60);
    for (t = 0; t < 2; t = t + 1) {
      if ((flags & 2U) == 0) {
        local_3e08 = &keys_pub;
      }
      else {
        local_3e08 = &keys_priv;
      }
      FlatSigningProvider::FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
      FlatSigningProvider::FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
      std::vector<CScript,_std::allocator<CScript>_>::vector
                ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd58);
      std::vector<CScript,_std::allocator<CScript>_>::vector
                ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd58);
      DescriptorCache::DescriptorCache((DescriptorCache *)in_stack_ffffffffffffbd58);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                   (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
        pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                           ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                            in_stack_ffffffffffffbd58);
        (*pDVar5->_vptr_Descriptor[8])
                  (pDVar5,i & 0xffffffff,local_3e08,&spks,&script_provider,&desc_cache);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd68,
                   SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbd60,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        in_stack_ffffffffffffbd58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_2780,local_27a0,(const_string *)(local_2820 + 0x60),0xfc,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffbd58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                   (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbd60,(char (*) [1])in_stack_ffffffffffffbd58
                  );
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        local_2820._8_8_ =
             std::vector<CScript,_std::allocator<CScript>_>::size
                       ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd58);
        local_2820._0_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffbd58);
        in_stack_ffffffffffffbd68 = "ref.size()";
        in_stack_ffffffffffffbd60 = (FlatSigningProvider *)local_2820;
        in_stack_ffffffffffffbd58 = "spks.size()";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                  (local_2820 + 0x20,local_2820 + 0x10,0xff,1,2,local_2820 + 8);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_ffffffffffffbd58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                   (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
        pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                           ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                            in_stack_ffffffffffffbd58);
        (*pDVar5->_vptr_Descriptor[9])
                  (pDVar5,i & 0xffffffff,&desc_cache,&spks_cached,&script_provider_cached);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd68,
                   SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbd60,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        in_stack_ffffffffffffbd58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_2858,local_2878,local_2898,0x102,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffbd58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                   (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
        std::operator==((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd88,
                        (vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd80);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd68,
                   SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbd60,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        in_stack_ffffffffffffbd58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_28d0,local_28f0,local_2910,0x103,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffbd58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                   (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
        GetKeyData((FlatSigningProvider *)
                   CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
                   (int)((ulong)in_stack_ffffffffffffbdf8 >> 0x20));
        GetKeyData((FlatSigningProvider *)
                   CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
                   (int)((ulong)in_stack_ffffffffffffbdf8 >> 0x20));
        std::operator==((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                        in_stack_ffffffffffffbd68,
                        (set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                        in_stack_ffffffffffffbd60);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd68,
                   SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbd60,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        in_stack_ffffffffffffbd58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_2948,local_2968,local_2988,0x104,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffbd58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd58);
        std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::~set
                  ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                   in_stack_ffffffffffffbd58);
        std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::~set
                  ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                   in_stack_ffffffffffffbd58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                   (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
        std::operator==((map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                         *)in_stack_ffffffffffffbd68,
                        (map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                         *)in_stack_ffffffffffffbd60);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd68,
                   SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbd60,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        in_stack_ffffffffffffbd58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_29c0,local_29e0,local_2a00,0x105,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffbd58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                   (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
        GetKeyOriginData((FlatSigningProvider *)in_stack_ffffffffffffbe08,in_stack_ffffffffffffbe04)
        ;
        GetKeyOriginData((FlatSigningProvider *)in_stack_ffffffffffffbe08,in_stack_ffffffffffffbe04)
        ;
        std::operator==((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                         *)in_stack_ffffffffffffbd68,
                        (set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                         *)in_stack_ffffffffffffbd60);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd68,
                   SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbd60,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                   (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
        in_stack_ffffffffffffbd58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_2a38,local_2a58,local_2a78,0x106,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffbd58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd58);
        std::
        set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
        ::~set((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                *)in_stack_ffffffffffffbd58);
        std::
        set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
        ::~set((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                *)in_stack_ffffffffffffbd58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      DescriptorCache::GetCachedDerivedExtPubKeys((DescriptorCache *)in_stack_ffffffffffffbd60);
      DescriptorCache::GetCachedParentExtPubKeys((DescriptorCache *)in_stack_ffffffffffffbd60);
      num_xpubs = CountXpubs((string *)in_stack_ffffffffffffbd68);
      if (((flags & 1U) == 0) || ((flags & 0x10U) != 0)) {
        if (num_xpubs == 0) {
          if ((flags & 0x20U) == 0) {
            do {
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              boost::unit_test::basic_cstring<const_char>::basic_cstring
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
              boost::unit_test::unit_test_log_t::set_checkpoint
                        ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                         (const_string *)
                         CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                         (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80
                        );
              std::
              unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
              ::empty((unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
                       *)in_stack_ffffffffffffbd58);
              boost::test_tools::assertion_result::assertion_result
                        ((assertion_result *)in_stack_ffffffffffffbd68,
                         SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
              boost::unit_test::lazy_ostream::instance();
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              boost::unit_test::operator<<
                        ((lazy_ostream *)in_stack_ffffffffffffbd60,
                         (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              in_stack_ffffffffffffbd58 = (char *)0x0;
              boost::test_tools::tt_detail::report_assertion
                        (local_2fb8,local_2fd8,local_2ff8,0x144,CHECK,CHECK_PRED);
              boost::unit_test::
              lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
              ::~lazy_ostream_impl
                        ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                          *)in_stack_ffffffffffffbd58);
              boost::test_tools::assertion_result::~assertion_result
                        ((assertion_result *)in_stack_ffffffffffffbd58);
              bVar2 = boost::test_tools::tt_detail::dummy_cond();
            } while (bVar2);
            do {
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              boost::unit_test::basic_cstring<const_char>::basic_cstring
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
              boost::unit_test::unit_test_log_t::set_checkpoint
                        ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                         (const_string *)
                         CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                         (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80
                        );
              std::
              unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
              ::empty((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                       *)in_stack_ffffffffffffbd58);
              boost::test_tools::assertion_result::assertion_result
                        ((assertion_result *)in_stack_ffffffffffffbd68,
                         SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
              boost::unit_test::lazy_ostream::instance();
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              boost::unit_test::operator<<
                        ((lazy_ostream *)in_stack_ffffffffffffbd60,
                         (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              in_stack_ffffffffffffbd58 = (char *)0x0;
              boost::test_tools::tt_detail::report_assertion
                        (local_3030,local_3050,local_3070,0x145,CHECK,CHECK_PRED);
              boost::unit_test::
              lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
              ::~lazy_ostream_impl
                        ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                          *)in_stack_ffffffffffffbd58);
              boost::test_tools::assertion_result::~assertion_result
                        ((assertion_result *)in_stack_ffffffffffffbd58);
              bVar2 = boost::test_tools::tt_detail::dummy_cond();
            } while (bVar2);
          }
        }
        else {
          do {
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                       (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                       (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90)
                       ,(size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80)
            ;
            std::
            unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
            ::size((unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
                    *)in_stack_ffffffffffffbd58);
            std::
            unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
            ::size((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                    *)in_stack_ffffffffffffbd58);
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)in_stack_ffffffffffffbd68,
                       SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
            boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                       (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
            boost::unit_test::operator<<
                      ((lazy_ostream *)in_stack_ffffffffffffbd60,
                       (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                       (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
            in_stack_ffffffffffffbd58 = (char *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_2d60,local_2d80,local_2da0,0x124,CHECK,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)in_stack_ffffffffffffbd58);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_ffffffffffffbd58);
            bVar2 = boost::test_tools::tt_detail::dummy_cond();
          } while (bVar2);
          if ((flags & 0x20U) == 0) {
            do {
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              boost::unit_test::basic_cstring<const_char>::basic_cstring
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
              boost::unit_test::unit_test_log_t::set_checkpoint
                        ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                         (const_string *)
                         CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                         (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80
                        );
              std::
              map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
              ::size((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                      *)in_stack_ffffffffffffbd58);
              boost::test_tools::assertion_result::assertion_result
                        ((assertion_result *)in_stack_ffffffffffffbd68,
                         SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
              boost::unit_test::lazy_ostream::instance();
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              boost::unit_test::operator<<
                        ((lazy_ostream *)in_stack_ffffffffffffbd60,
                         (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              in_stack_ffffffffffffbd58 = (char *)0x0;
              boost::test_tools::tt_detail::report_assertion
                        (local_2dd8,local_2df8,local_2e18,0x126,CHECK,CHECK_PRED);
              boost::unit_test::
              lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
              ::~lazy_ostream_impl
                        ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                          *)in_stack_ffffffffffffbd58);
              boost::test_tools::assertion_result::~assertion_result
                        ((assertion_result *)in_stack_ffffffffffffbd58);
              bVar2 = boost::test_tools::tt_detail::dummy_cond();
            } while (bVar2);
          }
          std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::set
                    ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                     in_stack_ffffffffffffbd58);
          std::
          unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
          ::begin((unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
                   *)in_stack_ffffffffffffbd60);
          std::
          unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
          ::end((unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
                 *)in_stack_ffffffffffffbd60);
          while (bVar2 = std::__detail::operator==
                                   ((_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
                                     *)in_stack_ffffffffffffbd68,
                                    (_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
                                     *)in_stack_ffffffffffffbd60), ((bVar2 ^ 0xffU) & 1) != 0) {
            std::__detail::
            _Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
            ::operator*((_Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
                         *)in_stack_ffffffffffffbd58);
            std::
            unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
            ::begin((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                     *)in_stack_ffffffffffffbd60);
            std::
            unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
            ::end((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                   *)in_stack_ffffffffffffbd60);
            while (bVar2 = std::__detail::operator==
                                     ((_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                                       *)in_stack_ffffffffffffbd68,
                                      (_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                                       *)in_stack_ffffffffffffbd60), ((bVar2 ^ 0xffU) & 1) != 0) {
              std::__detail::
              _Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
              operator*((_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>
                         *)in_stack_ffffffffffffbd58);
              std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::insert
                        ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                         in_stack_ffffffffffffbd68,(value_type *)in_stack_ffffffffffffbd60);
              std::__detail::
              _Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
              operator++((_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>
                          *)in_stack_ffffffffffffbd58);
            }
            std::__detail::
            _Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
            ::operator++((_Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
                          *)in_stack_ffffffffffffbd58);
          }
          std::
          unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
          ::begin((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                   *)in_stack_ffffffffffffbd60);
          __end5_1 = std::
                     unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                     ::end((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                            *)in_stack_ffffffffffffbd60);
          while (bVar2 = std::__detail::operator==
                                   ((_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                                     *)in_stack_ffffffffffffbd68,
                                    (_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                                     *)in_stack_ffffffffffffbd60), ((bVar2 ^ 0xffU) & 1) != 0) {
            std::__detail::
            _Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::operator*
                      ((_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>
                        *)in_stack_ffffffffffffbd58);
            std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::insert
                      ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                       in_stack_ffffffffffffbd68,(value_type *)in_stack_ffffffffffffbd60);
            CExtPubKey::CExtPubKey((CExtPubKey *)in_stack_ffffffffffffbd58);
            do {
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              boost::unit_test::basic_cstring<const_char>::basic_cstring
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
              boost::unit_test::unit_test_log_t::set_checkpoint
                        ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                         (const_string *)
                         CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                         (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80
                        );
              CExtPubKey::Derive(in_stack_ffffffffffffbd70,(CExtPubKey *)in_stack_ffffffffffffbd68,
                                 (uint)((ulong)in_stack_ffffffffffffbd60 >> 0x20));
              boost::test_tools::assertion_result::assertion_result
                        ((assertion_result *)in_stack_ffffffffffffbd68,
                         SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
              boost::unit_test::lazy_ostream::instance();
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              boost::unit_test::operator<<
                        ((lazy_ostream *)in_stack_ffffffffffffbd60,
                         (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              in_stack_ffffffffffffbd58 = (char *)0x0;
              boost::test_tools::tt_detail::report_assertion
                        (local_2e80,local_2ea0,local_2ec0,0x135,CHECK,CHECK_PRED);
              boost::unit_test::
              lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
              ::~lazy_ostream_impl
                        ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                          *)in_stack_ffffffffffffbd58);
              boost::test_tools::assertion_result::~assertion_result
                        ((assertion_result *)in_stack_ffffffffffffbd58);
              bVar2 = boost::test_tools::tt_detail::dummy_cond();
            } while (bVar2);
            std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::insert
                      ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                       in_stack_ffffffffffffbd68,(value_type *)in_stack_ffffffffffffbd60);
            std::__detail::
            _Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
            operator++((_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>
                        *)in_stack_ffffffffffffbd58);
          }
          count_pks_1 = 0;
          std::
          map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          ::begin((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                   *)in_stack_ffffffffffffbd60);
          __end5_2 = std::
                     map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                     ::end((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                            *)in_stack_ffffffffffffbd60);
          while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffbd68,
                                         (_Self *)in_stack_ffffffffffffbd60),
                ((bVar2 ^ 0xffU) & 1) != 0) {
            std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>::
            operator*((_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                       *)in_stack_ffffffffffffbd58);
            sVar8 = std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::count
                              ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                               in_stack_ffffffffffffbd68,(key_type *)in_stack_ffffffffffffbd60);
            count_pks_1 = count_pks_1 + (int)sVar8;
            std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>::
            operator++((_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                        *)in_stack_ffffffffffffbd58);
          }
          if ((flags & 0x20U) == 0) {
            do {
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              boost::unit_test::basic_cstring<const_char>::basic_cstring
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
              boost::unit_test::unit_test_log_t::set_checkpoint
                        ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                         (const_string *)
                         CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                         (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80
                        );
              boost::unit_test::lazy_ostream::instance();
              boost::unit_test::operator<<
                        ((lazy_ostream *)in_stack_ffffffffffffbd60,
                         (char (*) [1])in_stack_ffffffffffffbd58);
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              local_2f80 = std::
                           map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                           ::size((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                                   *)in_stack_ffffffffffffbd58);
              in_stack_ffffffffffffbd68 = "count_pks";
              in_stack_ffffffffffffbd60 = (FlatSigningProvider *)&count_pks_1;
              in_stack_ffffffffffffbd58 = "script_provider_cached.origins.size()";
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                        (local_2f68,local_2f78,0x140,1,2,&local_2f80);
              boost::unit_test::
              lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
              ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                                  *)in_stack_ffffffffffffbd58);
              bVar2 = boost::test_tools::tt_detail::dummy_cond();
            } while (bVar2);
          }
          else {
            do {
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              boost::unit_test::basic_cstring<const_char>::basic_cstring
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
              boost::unit_test::unit_test_log_t::set_checkpoint
                        ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                         (const_string *)
                         CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                         (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80
                        );
              boost::unit_test::lazy_ostream::instance();
              boost::unit_test::operator<<
                        ((lazy_ostream *)in_stack_ffffffffffffbd60,
                         (char (*) [1])in_stack_ffffffffffffbd58);
              boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                         (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58
                        );
              in_stack_ffffffffffffbd68 = "count_pks";
              in_stack_ffffffffffffbd60 = (FlatSigningProvider *)&count_pks_1;
              in_stack_ffffffffffffbd58 = "num_xpubs";
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                        (local_2f18,local_2f28,0x13e,1,2,&num_xpubs);
              boost::unit_test::
              lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
              ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                                  *)in_stack_ffffffffffffbd58);
              bVar2 = boost::test_tools::tt_detail::dummy_cond();
            } while (bVar2);
          }
          std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::~set
                    ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                     in_stack_ffffffffffffbd58);
        }
      }
      else {
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          std::
          unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
          ::empty((unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
                   *)in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd68,
                     SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbd58 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_2b28,local_2b48,local_2b68,0x10f,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          std::
          unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
          ::size((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                  *)in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd68,
                     SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbd58 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_2ba0,local_2bc0,local_2be0,0x110,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::set
                  ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                   in_stack_ffffffffffffbd58);
        std::
        unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
        ::begin((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                 *)in_stack_ffffffffffffbd60);
        __end4 = std::
                 unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                 ::end((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                        *)in_stack_ffffffffffffbd60);
        while (bVar2 = std::__detail::operator==
                                 ((_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                                   *)in_stack_ffffffffffffbd68,
                                  (_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                                   *)in_stack_ffffffffffffbd60), ((bVar2 ^ 0xffU) & 1) != 0) {
          std::__detail::
          _Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::operator*
                    ((_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>
                      *)in_stack_ffffffffffffbd58);
          CExtPubKey::CExtPubKey((CExtPubKey *)in_stack_ffffffffffffbd58);
          do {
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                       (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                       (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90)
                       ,(size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80)
            ;
            CExtPubKey::Derive(in_stack_ffffffffffffbd70,(CExtPubKey *)in_stack_ffffffffffffbd68,
                               (uint)((ulong)in_stack_ffffffffffffbd60 >> 0x20));
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)in_stack_ffffffffffffbd68,
                       SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
            boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                       (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
            boost::unit_test::operator<<
                      ((lazy_ostream *)in_stack_ffffffffffffbd60,
                       (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                       (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
            in_stack_ffffffffffffbd58 = (char *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_2c28,local_2c48,local_2c68,0x115,CHECK,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)in_stack_ffffffffffffbd58);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_ffffffffffffbd58);
            bVar2 = boost::test_tools::tt_detail::dummy_cond();
          } while (bVar2);
          std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::insert
                    ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                     in_stack_ffffffffffffbd68,(value_type *)in_stack_ffffffffffffbd60);
          std::__detail::
          _Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::operator++
                    ((_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>
                      *)in_stack_ffffffffffffbd58);
        }
        count_pks = 0;
        std::
        map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
        ::begin((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                 *)in_stack_ffffffffffffbd60);
        __end4_1 = std::
                   map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                   ::end((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                          *)in_stack_ffffffffffffbd60);
        while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffbd68,
                                       (_Self *)in_stack_ffffffffffffbd60),
              ((bVar2 ^ 0xffU) & 1) != 0) {
          std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>::
          operator*((_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                     *)in_stack_ffffffffffffbd58);
          sVar8 = std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::count
                            ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                             in_stack_ffffffffffffbd68,(key_type *)in_stack_ffffffffffffbd60);
          count_pks = count_pks + (int)sVar8;
          std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>::
          operator++((_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                      *)in_stack_ffffffffffffbd58);
        }
        if ((flags & 0x20U) == 0) {
          do {
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                       (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                       (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90)
                       ,(size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80)
            ;
            boost::unit_test::lazy_ostream::instance();
            boost::unit_test::operator<<
                      ((lazy_ostream *)in_stack_ffffffffffffbd60,
                       (char (*) [1])in_stack_ffffffffffffbd58);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                       (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
            local_2d28 = std::
                         map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                         ::size((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                                 *)in_stack_ffffffffffffbd58);
            in_stack_ffffffffffffbd68 = "count_pks";
            in_stack_ffffffffffffbd60 = (FlatSigningProvider *)&count_pks;
            in_stack_ffffffffffffbd58 = "script_provider_cached.origins.size()";
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                      (local_2d10,local_2d20,0x120,1,2,&local_2d28);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
            ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                                *)in_stack_ffffffffffffbd58);
            bVar2 = boost::test_tools::tt_detail::dummy_cond();
          } while (bVar2);
        }
        else {
          do {
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                       (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                       (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90)
                       ,(size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80)
            ;
            boost::unit_test::lazy_ostream::instance();
            boost::unit_test::operator<<
                      ((lazy_ostream *)in_stack_ffffffffffffbd60,
                       (char (*) [1])in_stack_ffffffffffffbd58);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                       (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
            in_stack_ffffffffffffbd68 = "count_pks";
            in_stack_ffffffffffffbd60 = (FlatSigningProvider *)&count_pks;
            in_stack_ffffffffffffbd58 = "num_xpubs";
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                      (local_2cc0,local_2cd0,0x11e,1,2,&num_xpubs);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
            ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                                *)in_stack_ffffffffffffbd58);
            bVar2 = boost::test_tools::tt_detail::dummy_cond();
          } while (bVar2);
        }
        std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::~set
                  ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                   in_stack_ffffffffffffbd58);
      }
      if ((flags & 0x10U) == 0) {
        FlatSigningProvider::FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
        FlatSigningProvider::FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
        std::vector<CScript,_std::allocator<CScript>_>::vector
                  ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd58);
        std::vector<CScript,_std::allocator<CScript>_>::vector
                  ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd58);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                             ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                              in_stack_ffffffffffffbd58);
          (*pDVar5->_vptr_Descriptor[8])
                    (pDVar5,(ulong)((int)i + 1),local_3e08,&spks1,&script_provider1,0);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd68,
                     SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbd58 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_30d8,local_30f8,local_3118,0x14d,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                             ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                              in_stack_ffffffffffffbd58);
          (*pDVar5->_vptr_Descriptor[9])
                    (pDVar5,(ulong)((int)i + 1),&desc_cache,&spk1_from_cache,
                     &script_provider_cached1);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd68,
                     SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbd58 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_3150,local_3170,local_3190,0x150,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          std::operator==((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd88,
                          (vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd80);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd68,
                     SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbd58 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_31c8,local_31e8,local_3208,0x151,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          GetKeyData((FlatSigningProvider *)
                     CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
                     (int)((ulong)in_stack_ffffffffffffbdf8 >> 0x20));
          GetKeyData((FlatSigningProvider *)
                     CONCAT44(in_stack_ffffffffffffbe04,in_stack_ffffffffffffbe00),
                     (int)((ulong)in_stack_ffffffffffffbdf8 >> 0x20));
          std::operator==((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                          in_stack_ffffffffffffbd68,
                          (set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                          in_stack_ffffffffffffbd60);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd68,
                     SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbd58 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_3240,local_3260,local_3280,0x152,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd58);
          std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::~set
                    ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                     in_stack_ffffffffffffbd58);
          std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::~set
                    ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                     in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          std::operator==((map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                           *)in_stack_ffffffffffffbd68,
                          (map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                           *)in_stack_ffffffffffffbd60);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd68,
                     SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbd58 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_32b8,local_32d8,local_32f8,0x153,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          GetKeyOriginData((FlatSigningProvider *)in_stack_ffffffffffffbe08,
                           in_stack_ffffffffffffbe04);
          GetKeyOriginData((FlatSigningProvider *)in_stack_ffffffffffffbe08,
                           in_stack_ffffffffffffbe04);
          std::operator==((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                           *)in_stack_ffffffffffffbd68,
                          (set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                           *)in_stack_ffffffffffffbd60);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd68,
                     SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbd58 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_3330,local_3350,local_3370,0x154,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd58);
          std::
          set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
          ::~set((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                  *)in_stack_ffffffffffffbd58);
          std::
          set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
          ::~set((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                  *)in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        std::vector<CScript,_std::allocator<CScript>_>::~vector
                  ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd68);
        std::vector<CScript,_std::allocator<CScript>_>::~vector
                  ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd68);
        FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
        FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
      }
      for (n = 0; sVar7 = std::vector<CScript,_std::allocator<CScript>_>::size
                                    ((vector<CScript,_std::allocator<CScript>_> *)
                                     in_stack_ffffffffffffbd58), n < sVar7; n = n + 1) {
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (char (*) [1])in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_ffffffffffffbd68,(size_type)in_stack_ffffffffffffbd60);
          std::vector<CScript,_std::allocator<CScript>_>::operator[]
                    ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd68,
                     (size_type)in_stack_ffffffffffffbd60);
          Span<const_unsigned_char>::Span<CScript>
                    ((Span<const_unsigned_char> *)in_stack_ffffffffffffbd68,
                     (CScript *)in_stack_ffffffffffffbd60,in_stack_ffffffffffffbd58);
          s.m_size._0_7_ = in_stack_ffffffffffffbde8;
          s.m_data = &in_stack_ffffffffffffbde0->complete;
          s.m_size._7_1_ = in_stack_ffffffffffffbdef;
          HexStr_abi_cxx11_(s);
          in_stack_ffffffffffffbd68 = "HexStr(spks[n])";
          in_stack_ffffffffffffbd60 = (FlatSigningProvider *)local_1138;
          in_stack_ffffffffffffbd58 = "ref[n]";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                    (local_33b0,local_33c0,0x159,1,2,pvVar9);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd58);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        if ((flags & 0x108U) != 0) {
          CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffbd58)
          ;
          std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                     CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                     (size_type)in_stack_ffffffffffffbd70);
          pvVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffbd68,
                               (size_type)in_stack_ffffffffffffbd60);
          pvVar10->nSequence = spender_nsequence;
          std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                     CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                     (size_type)in_stack_ffffffffffffbd70);
          provider = (SigningProvider *)&local_3421;
          std::allocator<CTxOut>::allocator((allocator<CTxOut> *)in_stack_ffffffffffffbd58);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffbd88,
                     (size_type)in_stack_ffffffffffffbd80,
                     (allocator_type *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78)
                    );
          std::allocator<CTxOut>::~allocator((allocator<CTxOut> *)in_stack_ffffffffffffbd58);
          PrecomputedTransactionData::PrecomputedTransactionData
                    ((PrecomputedTransactionData *)in_stack_ffffffffffffbd58);
          PrecomputedTransactionData::Init<CMutableTransaction>
                    (in_stack_ffffffffffffbd98,
                     (CMutableTransaction *)
                     CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffbd88,
                     SUB81((ulong)in_stack_ffffffffffffbd80 >> 0x38,0));
          local_3480 = 0;
          MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
                    ((MutableTransactionSignatureCreator *)in_stack_ffffffffffffbda8,
                     in_stack_ffffffffffffbda0,(uint)((ulong)in_stack_ffffffffffffbd98 >> 0x20),
                     (CAmount *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     in_stack_ffffffffffffbd88,(int)((ulong)in_stack_ffffffffffffbd80 >> 0x20));
          SignatureData::SignatureData
                    ((SignatureData *)CONCAT17(in_stack_ffffffffffffbdef,in_stack_ffffffffffffbde8))
          ;
          std::
          map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::operator=((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)in_stack_ffffffffffffbd68,
                      (map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)in_stack_ffffffffffffbd60);
          std::
          map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::operator=((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)in_stack_ffffffffffffbd68,
                      (map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)in_stack_ffffffffffffbd60);
          std::
          map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::operator=((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)in_stack_ffffffffffffbd68,
                      (map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)in_stack_ffffffffffffbd60);
          std::
          map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::operator=((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)in_stack_ffffffffffffbd68,
                      (map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)in_stack_ffffffffffffbd60);
          FlatSigningProvider::FlatSigningProvider
                    ((FlatSigningProvider *)in_stack_ffffffffffffbd98,
                     (FlatSigningProvider *)
                     CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90));
          FlatSigningProvider::FlatSigningProvider
                    ((FlatSigningProvider *)in_stack_ffffffffffffbd98,
                     (FlatSigningProvider *)
                     CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90));
          creator_00 = FlatSigningProvider::Merge
                                 ((FlatSigningProvider *)in_stack_ffffffffffffbd68,
                                  in_stack_ffffffffffffbd60);
          std::vector<CScript,_std::allocator<CScript>_>::operator[]
                    ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd68,
                     (size_type)in_stack_ffffffffffffbd60);
          in_stack_ffffffffffffbe7f =
               ProduceSignature(provider,(BaseSignatureCreator *)creator_00,
                                (CScript *)
                                CONCAT17(in_stack_ffffffffffffbe7f,in_stack_ffffffffffffbe78),
                                in_stack_ffffffffffffbe70);
          FlatSigningProvider::~FlatSigningProvider
                    ((FlatSigningProvider *)in_stack_ffffffffffffbd58);
          FlatSigningProvider::~FlatSigningProvider
                    ((FlatSigningProvider *)in_stack_ffffffffffffbd58);
          do {
            in_stack_ffffffffffffbe70 = boost::unit_test::(anonymous_namespace)::unit_test_log;
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                       (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                       (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90)
                       ,(size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80)
            ;
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)in_stack_ffffffffffffbd68,
                       SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
            boost::unit_test::lazy_ostream::instance();
            boost::unit_test::operator<<
                      ((lazy_ostream *)in_stack_ffffffffffffbd60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffbd58);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                       (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
            in_stack_ffffffffffffbd58 = (char *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_34b8,local_34d8,(const_string *)&stack0xffffffffffffcb18,0x16c,CHECK);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)in_stack_ffffffffffffbd58);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_ffffffffffffbd58);
            bVar2 = boost::test_tools::tt_detail::dummy_cond();
          } while (bVar2);
          SignatureData::~SignatureData((SignatureData *)in_stack_ffffffffffffbd58);
          PrecomputedTransactionData::~PrecomputedTransactionData
                    ((PrecomputedTransactionData *)in_stack_ffffffffffffbd58);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffbd68);
          CMutableTransaction::~CMutableTransaction
                    ((CMutableTransaction *)in_stack_ffffffffffffbd58);
        }
        std::vector<CScript,_std::allocator<CScript>_>::operator[]
                  ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd68,
                   (size_type)in_stack_ffffffffffffbd60);
        InferDescriptor((CScript *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                        (SigningProvider *)in_stack_ffffffffffffbd70);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (char (*) [1])in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                             ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                              in_stack_ffffffffffffbd58);
          iVar4 = (*pDVar5->_vptr_Descriptor[3])();
          local_3542[1] = (byte)iVar4 & 1;
          local_3542[0] = (flags & 4U) == 0;
          in_stack_ffffffffffffbd68 = "!(flags & UNSOLVABLE)";
          in_stack_ffffffffffffbd60 = (FlatSigningProvider *)local_3542;
          in_stack_ffffffffffffbd58 = "inferred->IsSolvable()";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                    (local_3542 + 0x12,local_3542 + 2,0x171,1,2,local_3542 + 1);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        std::vector<CScript,_std::allocator<CScript>_>::vector
                  ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd58);
        FlatSigningProvider::FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                             ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                              in_stack_ffffffffffffbd58);
          (*pDVar5->_vptr_Descriptor[8])
                    (pDVar5,0,&provider_inferred,&spks_inferred,&provider_inferred,0);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd68,
                     SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbd58 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_3598,local_35b8,(const_string *)(local_3634 + 0x5c),0x174,CHECK,
                     CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (char (*) [1])in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          local_3634._4_8_ =
               std::vector<CScript,_std::allocator<CScript>_>::size
                         ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd58);
          local_3634._0_4_ = 1;
          in_stack_ffffffffffffbd68 = "1U";
          in_stack_ffffffffffffbd60 = (FlatSigningProvider *)local_3634;
          in_stack_ffffffffffffbd58 = "spks_inferred.size()";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                    (local_3634 + 0x1c,local_3634 + 0xc,0x175,1,2,local_3634 + 4);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        do {
          in_stack_ffffffffffffbe08 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          in_stack_ffffffffffffbdf8 =
               std::vector<CScript,_std::allocator<CScript>_>::operator[]
                         ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd68,
                          (size_type)in_stack_ffffffffffffbd60);
          std::vector<CScript,_std::allocator<CScript>_>::operator[]
                    ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd68,
                     (size_type)in_stack_ffffffffffffbd60);
          bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                             in_stack_ffffffffffffbd70,
                             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                             in_stack_ffffffffffffbd68);
          in_stack_ffffffffffffbe04 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffbe04);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd68,
                     SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbd58 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_3670,local_3690,(const_string *)(local_3711 + 0x61),0x176,CHECK,
                     CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbdef = boost::test_tools::tt_detail::dummy_cond();
        } while ((bool)in_stack_ffffffffffffbdef);
        do {
          in_stack_ffffffffffffbde0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (char (*) [1])in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          std::vector<CScript,_std::allocator<CScript>_>::operator[]
                    ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd68,
                     (size_type)in_stack_ffffffffffffbd60);
          InferDescriptor((CScript *)CONCAT17(in_stack_ffffffffffffbd7f,in_stack_ffffffffffffbd78),
                          (SigningProvider *)in_stack_ffffffffffffbd70);
          pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                             ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                              in_stack_ffffffffffffbd58);
          iVar4 = (*pDVar5->_vptr_Descriptor[3])();
          local_3711[0x10] = (char)iVar4 & _S_black;
          local_3711[0] = (flags & 4U) == 0;
          in_stack_ffffffffffffbd68 = "!(flags & UNSOLVABLE)";
          in_stack_ffffffffffffbd60 = (FlatSigningProvider *)local_3711;
          in_stack_ffffffffffffbd58 =
               "InferDescriptor(spks_inferred[0], provider_inferred)->IsSolvable()";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                    (local_3711 + 0x21,local_3711 + 0x11,0x177,1,2,local_3711 + 0x10);
          std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::~unique_ptr
                    ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                     in_stack_ffffffffffffbd68);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          GetKeyOriginData((FlatSigningProvider *)in_stack_ffffffffffffbe08,
                           in_stack_ffffffffffffbe04);
          GetKeyOriginData((FlatSigningProvider *)in_stack_ffffffffffffbe08,
                           in_stack_ffffffffffffbe04);
          std::operator==((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                           *)in_stack_ffffffffffffbd68,
                          (set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                           *)in_stack_ffffffffffffbd60);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd68,
                     SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbd58 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_3750,local_3770,local_3790,0x178,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd58);
          std::
          set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
          ::~set((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                  *)in_stack_ffffffffffffbd58);
          std::
          set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
          ::~set((set<std::pair<CPubKey,_KeyOriginInfo>,_std::less<std::pair<CPubKey,_KeyOriginInfo>_>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                  *)in_stack_ffffffffffffbd58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
        std::vector<CScript,_std::allocator<CScript>_>::~vector
                  ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd68);
        std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::~unique_ptr
                  ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                   in_stack_ffffffffffffbd68);
      }
      std::
      map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
      ::begin((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
               *)in_stack_ffffffffffffbd60);
      __end3 = std::
               map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
               ::end((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                      *)in_stack_ffffffffffffbd60);
      while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffbd68,
                                     (_Self *)in_stack_ffffffffffffbd60), ((bVar2 ^ 0xffU) & 1) != 0
            ) {
        std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>::
        operator*((_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_> *
                  )in_stack_ffffffffffffbd58);
        do {
          in_stack_ffffffffffffbda8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbd98,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
                     (size_t)in_stack_ffffffffffffbd88,(const_string *)in_stack_ffffffffffffbd80);
          in_stack_ffffffffffffbda0 =
               (CMutableTransaction *)
               std::
               set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::count((set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)in_stack_ffffffffffffbd68,(key_type *)in_stack_ffffffffffffbd60);
          local_37e0 = in_stack_ffffffffffffbda0;
          boost::test_tools::assertion_result::assertion_result<unsigned_long>
                    ((assertion_result *)in_stack_ffffffffffffbd68,
                     (unsigned_long *)in_stack_ffffffffffffbd60);
          in_stack_ffffffffffffbd98 =
               (PrecomputedTransactionData *)boost::unit_test::lazy_ostream::instance();
          std::operator+(&in_stack_ffffffffffffbda8->complete,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffbda0);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbd60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
                     (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbd58 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_37d8,local_3800,&local_3810,0x17e,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_ffffffffffffbd58);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbd58);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_ffffffffffffbd58);
          in_stack_ffffffffffffbd97 = boost::test_tools::tt_detail::dummy_cond();
        } while ((bool)in_stack_ffffffffffffbd97);
        std::
        set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::erase((set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)in_stack_ffffffffffffbd68,(key_type *)in_stack_ffffffffffffbd60);
        std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>::
        operator++((_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                    *)in_stack_ffffffffffffbd58);
      }
      std::
      unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
      ::~unordered_map((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                        *)in_stack_ffffffffffffbd58);
      std::
      unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
      ::~unordered_map((unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
                        *)in_stack_ffffffffffffbd58);
      DescriptorCache::~DescriptorCache((DescriptorCache *)in_stack_ffffffffffffbd58);
      std::vector<CScript,_std::allocator<CScript>_>::~vector
                ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd68);
      std::vector<CScript,_std::allocator<CScript>_>::~vector
                ((vector<CScript,_std::allocator<CScript>_> *)in_stack_ffffffffffffbd68);
      FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
      FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
    }
  }
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffbd98,
               (const_string *)CONCAT17(in_stack_ffffffffffffbd97,in_stack_ffffffffffffbd90),
               (size_t)line_num,(const_string *)in_stack_ffffffffffffbd80);
    std::
    set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::empty((set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd68,
               SUB81((ulong)in_stack_ffffffffffffbd60 >> 0x38,0));
    in_stack_ffffffffffffbd80 = boost::unit_test::lazy_ostream::instance();
    std::operator+(&in_stack_ffffffffffffbda8->complete,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffbda0);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffbd60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd68,
               (pointer)in_stack_ffffffffffffbd60,(unsigned_long)in_stack_ffffffffffffbd58);
    in_stack_ffffffffffffbd58 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_3848,local_3868,&local_3878,0x185,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffbd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffbd58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffbd58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffbd58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffbd58);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)in_stack_ffffffffffffbd68);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)in_stack_ffffffffffffbd68);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffbd58);
  std::
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~set((set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *)in_stack_ffffffffffffbd58);
  FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
  FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)in_stack_ffffffffffffbd58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DoCheck(std::string prv, std::string pub, const std::string& norm_pub, int flags,
             const std::vector<std::vector<std::string>>& scripts, const std::optional<OutputType>& type, std::optional<uint256> op_desc_id = std::nullopt,
             const std::set<std::vector<uint32_t>>& paths = ONLY_EMPTY, bool replace_apostrophe_with_h_in_prv=false,
             bool replace_apostrophe_with_h_in_pub=false, uint32_t spender_nlocktime=0, uint32_t spender_nsequence=CTxIn::SEQUENCE_FINAL,
             std::map<std::vector<uint8_t>, std::vector<uint8_t>> preimages={},
             std::optional<std::string> expected_prv = std::nullopt, std::optional<std::string> expected_pub = std::nullopt, int desc_index = 0)
{
    FlatSigningProvider keys_priv, keys_pub;
    std::set<std::vector<uint32_t>> left_paths = paths;
    std::string error;

    std::vector<std::unique_ptr<Descriptor>> parse_privs;
    std::vector<std::unique_ptr<Descriptor>> parse_pubs;
    // Check that parsing succeeds.
    if (replace_apostrophe_with_h_in_prv) {
        prv = UseHInsteadOfApostrophe(prv);
    }
    parse_privs = Parse(prv, keys_priv, error);
    BOOST_CHECK_MESSAGE(!parse_privs.empty(), error);
    if (replace_apostrophe_with_h_in_pub) {
        pub = UseHInsteadOfApostrophe(pub);
    }
    parse_pubs = Parse(pub, keys_pub, error);
    BOOST_CHECK_MESSAGE(!parse_pubs.empty(), error);

    auto& parse_priv = parse_privs.at(desc_index);
    auto& parse_pub = parse_pubs.at(desc_index);

    // We must be able to estimate the max satisfaction size for any solvable descriptor top descriptor (but combo).
    const bool is_nontop_or_nonsolvable{!parse_priv->IsSolvable() || !parse_priv->GetOutputType()};
    const auto max_sat_maxsig{parse_priv->MaxSatisfactionWeight(true)};
    const auto max_sat_nonmaxsig{parse_priv->MaxSatisfactionWeight(true)};
    const auto max_elems{parse_priv->MaxSatisfactionElems()};
    const bool is_input_size_info_set{max_sat_maxsig && max_sat_nonmaxsig && max_elems};
    BOOST_CHECK_MESSAGE(is_input_size_info_set || is_nontop_or_nonsolvable, prv);

    // The ScriptSize() must match the size of the Script string. (ScriptSize() is set for all descs but 'combo()'.)
    const bool is_combo{!parse_priv->IsSingleType()};
    BOOST_CHECK_MESSAGE(is_combo || parse_priv->ScriptSize() == scripts[0][0].size() / 2, "Invalid ScriptSize() for " + prv);

    // Check that the correct OutputType is inferred
    BOOST_CHECK(parse_priv->GetOutputType() == type);
    BOOST_CHECK(parse_pub->GetOutputType() == type);

    // Check private keys are extracted from the private version but not the public one.
    BOOST_CHECK(keys_priv.keys.size());
    BOOST_CHECK(!keys_pub.keys.size());

    // If expected_pub is provided, check that the serialize matches that.
    // Otherwise check that they serialize back to the public version.
    std::string pub1 = parse_priv->ToString();
    std::string pub2 = parse_pub->ToString();
    if (expected_pub) {
        BOOST_CHECK_MESSAGE(EqualDescriptor(*expected_pub, pub1), "Private ser: " + pub1 + " Public desc: " + *expected_pub);
        BOOST_CHECK_MESSAGE(EqualDescriptor(*expected_pub, pub2), "Public ser: " + pub2 + " Public desc: " + *expected_pub);
    } else {
        BOOST_CHECK_MESSAGE(EqualDescriptor(pub, pub1), "Private ser: " + pub1 + " Public desc: " + pub);
        BOOST_CHECK_MESSAGE(EqualDescriptor(pub, pub2), "Public ser: " + pub2 + " Public desc: " + pub);
    }

    // Check that the COMPAT identifier did not change
    if (op_desc_id) {
        BOOST_CHECK_MESSAGE(DescriptorID(*parse_priv) == *op_desc_id, "DescriptorID() " + DescriptorID(*parse_priv).ToString() + " does not match for priv " + prv);
    }

    // Check that both can be serialized with private key back to the private version, but not without private key.
    if (!(flags & MISSING_PRIVKEYS)) {
        std::string prv1;
        BOOST_CHECK(parse_priv->ToPrivateString(keys_priv, prv1));
        if (expected_prv) {
            BOOST_CHECK_MESSAGE(EqualDescriptor(*expected_prv, prv1), "Private ser: " + prv1 + "Private desc: " + *expected_prv);
        } else {
            BOOST_CHECK_MESSAGE(EqualDescriptor(prv, prv1), "Private ser: " + prv1 + " Private desc: " + prv);
        }
        BOOST_CHECK(!parse_priv->ToPrivateString(keys_pub, prv1));
        BOOST_CHECK(parse_pub->ToPrivateString(keys_priv, prv1));
        if (expected_prv) {
            BOOST_CHECK(EqualDescriptor(*expected_prv, prv1));
            BOOST_CHECK_MESSAGE(EqualDescriptor(*expected_prv, prv1), "Private ser: " + prv1 + " Private desc: " + *expected_prv);
        } else {
            BOOST_CHECK_MESSAGE(EqualDescriptor(prv, prv1), "Private ser: " + prv1 + " Private desc: " + prv);
        }
        BOOST_CHECK(!parse_pub->ToPrivateString(keys_pub, prv1));
    }

    // Check that private can produce the normalized descriptors
    std::string norm1;
    BOOST_CHECK(parse_priv->ToNormalizedString(keys_priv, norm1));
    BOOST_CHECK_MESSAGE(EqualDescriptor(norm1, norm_pub), "priv->ToNormalizedString(): " + norm1 + " Norm. desc: " + norm_pub);
    BOOST_CHECK(parse_pub->ToNormalizedString(keys_priv, norm1));
    BOOST_CHECK_MESSAGE(EqualDescriptor(norm1, norm_pub), "pub->ToNormalizedString(): " + norm1 + " Norm. desc: " + norm_pub);

    // Check whether IsRange on both returns the expected result
    BOOST_CHECK_EQUAL(parse_pub->IsRange(), (flags & RANGE) != 0);
    BOOST_CHECK_EQUAL(parse_priv->IsRange(), (flags & RANGE) != 0);

    // * For ranged descriptors,  the `scripts` parameter is a list of expected result outputs, for subsequent
    //   positions to evaluate the descriptors on (so the first element of `scripts` is for evaluating the
    //   descriptor at 0; the second at 1; and so on). To verify this, we evaluate the descriptors once for
    //   each element in `scripts`.
    // * For non-ranged descriptors, we evaluate the descriptors at positions 0, 1, and 2, but expect the
    //   same result in each case, namely the first element of `scripts`. Because of that, the size of
    //   `scripts` must be one in that case.
    if (!(flags & RANGE)) assert(scripts.size() == 1);
    size_t max = (flags & RANGE) ? scripts.size() : 3;

    // Iterate over the position we'll evaluate the descriptors in.
    for (size_t i = 0; i < max; ++i) {
        // Call the expected result scripts `ref`.
        const auto& ref = scripts[(flags & RANGE) ? i : 0];
        // When t=0, evaluate the `prv` descriptor; when t=1, evaluate the `pub` descriptor.
        for (int t = 0; t < 2; ++t) {
            // When the descriptor is hardened, evaluate with access to the private keys inside.
            const FlatSigningProvider& key_provider = (flags & HARDENED) ? keys_priv : keys_pub;

            // Evaluate the descriptor selected by `t` in position `i`.
            FlatSigningProvider script_provider, script_provider_cached;
            std::vector<CScript> spks, spks_cached;
            DescriptorCache desc_cache;
            BOOST_CHECK((t ? parse_priv : parse_pub)->Expand(i, key_provider, spks, script_provider, &desc_cache));

            // Compare the output with the expected result.
            BOOST_CHECK_EQUAL(spks.size(), ref.size());

            // Try to expand again using cached data, and compare.
            BOOST_CHECK(parse_pub->ExpandFromCache(i, desc_cache, spks_cached, script_provider_cached));
            BOOST_CHECK(spks == spks_cached);
            BOOST_CHECK(GetKeyData(script_provider, flags) == GetKeyData(script_provider_cached, flags));
            BOOST_CHECK(script_provider.scripts == script_provider_cached.scripts);
            BOOST_CHECK(GetKeyOriginData(script_provider, flags) == GetKeyOriginData(script_provider_cached, flags));

            // Check whether keys are in the cache
            const auto& der_xpub_cache = desc_cache.GetCachedDerivedExtPubKeys();
            const auto& parent_xpub_cache = desc_cache.GetCachedParentExtPubKeys();
            const size_t num_xpubs = CountXpubs(pub1);
            if ((flags & RANGE) && !(flags & (DERIVE_HARDENED))) {
                // For ranged, unhardened derivation, None of the keys in origins should appear in the cache but the cache should have parent keys
                // But we can derive one level from each of those parent keys and find them all
                BOOST_CHECK(der_xpub_cache.empty());
                BOOST_CHECK(parent_xpub_cache.size() > 0);
                std::set<CPubKey> pubkeys;
                for (const auto& xpub_pair : parent_xpub_cache) {
                    const CExtPubKey& xpub = xpub_pair.second;
                    CExtPubKey der;
                    BOOST_CHECK(xpub.Derive(der, i));
                    pubkeys.insert(der.pubkey);
                }
                int count_pks = 0;
                for (const auto& origin_pair : script_provider_cached.origins) {
                    const CPubKey& pk = origin_pair.second.first;
                    count_pks += pubkeys.count(pk);
                }
                if (flags & MIXED_PUBKEYS) {
                    BOOST_CHECK_EQUAL(num_xpubs, count_pks);
                } else {
                    BOOST_CHECK_EQUAL(script_provider_cached.origins.size(), count_pks);
                }
            } else if (num_xpubs > 0) {
                // For ranged, hardened derivation, or not ranged, but has an xpub, all of the keys should appear in the cache
                BOOST_CHECK(der_xpub_cache.size() + parent_xpub_cache.size() == num_xpubs);
                if (!(flags & MIXED_PUBKEYS)) {
                    BOOST_CHECK(num_xpubs == script_provider_cached.origins.size());
                }
                // Get all of the derived pubkeys
                std::set<CPubKey> pubkeys;
                for (const auto& xpub_map_pair : der_xpub_cache) {
                    for (const auto& xpub_pair : xpub_map_pair.second) {
                        const CExtPubKey& xpub = xpub_pair.second;
                        pubkeys.insert(xpub.pubkey);
                    }
                }
                // Derive one level from all of the parents
                for (const auto& xpub_pair : parent_xpub_cache) {
                    const CExtPubKey& xpub = xpub_pair.second;
                    pubkeys.insert(xpub.pubkey);
                    CExtPubKey der;
                    BOOST_CHECK(xpub.Derive(der, i));
                    pubkeys.insert(der.pubkey);
                }
                int count_pks = 0;
                for (const auto& origin_pair : script_provider_cached.origins) {
                    const CPubKey& pk = origin_pair.second.first;
                    count_pks += pubkeys.count(pk);
                }
                if (flags & MIXED_PUBKEYS) {
                    BOOST_CHECK_EQUAL(num_xpubs, count_pks);
                } else {
                    BOOST_CHECK_EQUAL(script_provider_cached.origins.size(), count_pks);
                }
            } else if (!(flags & MIXED_PUBKEYS)) {
                // Only const pubkeys, nothing should be cached
                BOOST_CHECK(der_xpub_cache.empty());
                BOOST_CHECK(parent_xpub_cache.empty());
            }

            // Make sure we can expand using cached xpubs for unhardened derivation
            if (!(flags & DERIVE_HARDENED)) {
                // Evaluate the descriptor at i + 1
                FlatSigningProvider script_provider1, script_provider_cached1;
                std::vector<CScript> spks1, spk1_from_cache;
                BOOST_CHECK((t ? parse_priv : parse_pub)->Expand(i + 1, key_provider, spks1, script_provider1, nullptr));

                // Try again but use the cache from expanding i. That cache won't have the pubkeys for i + 1, but will have the parent xpub for derivation.
                BOOST_CHECK(parse_pub->ExpandFromCache(i + 1, desc_cache, spk1_from_cache, script_provider_cached1));
                BOOST_CHECK(spks1 == spk1_from_cache);
                BOOST_CHECK(GetKeyData(script_provider1, flags) == GetKeyData(script_provider_cached1, flags));
                BOOST_CHECK(script_provider1.scripts == script_provider_cached1.scripts);
                BOOST_CHECK(GetKeyOriginData(script_provider1, flags) == GetKeyOriginData(script_provider_cached1, flags));
            }

            // For each of the produced scripts, verify solvability, and when possible, try to sign a transaction spending it.
            for (size_t n = 0; n < spks.size(); ++n) {
                BOOST_CHECK_EQUAL(ref[n], HexStr(spks[n]));

                if (flags & (SIGNABLE | SIGNABLE_FAILS)) {
                    CMutableTransaction spend;
                    spend.nLockTime = spender_nlocktime;
                    spend.vin.resize(1);
                    spend.vin[0].nSequence = spender_nsequence;
                    spend.vout.resize(1);
                    std::vector<CTxOut> utxos(1);
                    PrecomputedTransactionData txdata;
                    txdata.Init(spend, std::move(utxos), /*force=*/true);
                    MutableTransactionSignatureCreator creator{spend, 0, CAmount{0}, &txdata, SIGHASH_DEFAULT};
                    SignatureData sigdata;
                    // We assume there is no collision between the hashes (eg h1=SHA256(SHA256(x)) and h2=SHA256(x))
                    sigdata.sha256_preimages = preimages;
                    sigdata.hash256_preimages = preimages;
                    sigdata.ripemd160_preimages = preimages;
                    sigdata.hash160_preimages = preimages;
                    const auto prod_sig_res = ProduceSignature(FlatSigningProvider{keys_priv}.Merge(FlatSigningProvider{script_provider}), creator, spks[n], sigdata);
                    BOOST_CHECK_MESSAGE(prod_sig_res == !(flags & SIGNABLE_FAILS), prv);
                }

                /* Infer a descriptor from the generated script, and verify its solvability and that it roundtrips. */
                auto inferred = InferDescriptor(spks[n], script_provider);
                BOOST_CHECK_EQUAL(inferred->IsSolvable(), !(flags & UNSOLVABLE));
                std::vector<CScript> spks_inferred;
                FlatSigningProvider provider_inferred;
                BOOST_CHECK(inferred->Expand(0, provider_inferred, spks_inferred, provider_inferred));
                BOOST_CHECK_EQUAL(spks_inferred.size(), 1U);
                BOOST_CHECK(spks_inferred[0] == spks[n]);
                BOOST_CHECK_EQUAL(InferDescriptor(spks_inferred[0], provider_inferred)->IsSolvable(), !(flags & UNSOLVABLE));
                BOOST_CHECK(GetKeyOriginData(provider_inferred, flags) == GetKeyOriginData(script_provider, flags));
            }

            // Test whether the observed key path is present in the 'paths' variable (which contains expected, unobserved paths),
            // and then remove it from that set.
            for (const auto& origin : script_provider.origins) {
                BOOST_CHECK_MESSAGE(paths.count(origin.second.second.path), "Unexpected key path: " + prv);
                left_paths.erase(origin.second.second.path);
            }
        }
    }

    // Verify no expected paths remain that were not observed.
    BOOST_CHECK_MESSAGE(left_paths.empty(), "Not all expected key paths found: " + prv);
}